

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O0

void __thiscall WorkItemScheduler::work_dispatch(WorkItemScheduler *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  system_error *psVar4;
  errc *peVar5;
  ssize_t sVar6;
  mapped_type *pmVar7;
  error_code eVar8;
  error_code __ec;
  error_code __ec_00;
  byte local_71;
  int local_24;
  int rv;
  Events event;
  epoll_event ev;
  bool skip_polling;
  WorkItemScheduler *this_local;
  
  ev.data.fd._0_1_ = 0;
  unique0x10000213 = this;
  memset((void *)((long)&rv + 3),0,0xc);
  local_24 = 0;
LAB_001112a2:
  local_71 = 1;
  if ((this->active_ & 1U) == 0) {
    bVar1 = std::
            deque<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
            ::empty(&this->work_);
    local_71 = bVar1 ^ 0xff;
  }
  if ((local_71 & 1) == 0) {
    return;
  }
  if ((ev.data.u32._0_1_ & 1) == 0) goto code_r0x001112e0;
  goto LAB_00111463;
code_r0x001112e0:
  unique0x1000016a = 0;
  ev.events = 0;
  do {
    iVar2 = epoll_wait(this->epoll_fd_,(epoll_event *)((long)&rv + 3),1,100);
    if ((iVar2 == -1) && (piVar3 = __errno_location(), *piVar3 != 4)) {
      psVar4 = (system_error *)__cxa_allocate_exception(0x20);
      peVar5 = (errc *)__errno_location();
      eVar8 = std::make_error_code(*peVar5);
      __ec._M_cat = eVar8._M_cat;
      __ec._4_4_ = 0;
      __ec._M_value = eVar8._M_value;
      std::system_error::system_error(psVar4,__ec,"Call to epoll_wait(2) failed");
      __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    do {
      sVar6 = read(stack0xffffffffffffffe7,&local_24,4);
      if (((int)sVar6 == -1) && (piVar3 = __errno_location(), *piVar3 != 4)) {
        psVar4 = (system_error *)__cxa_allocate_exception(0x20);
        peVar5 = (errc *)__errno_location();
        eVar8 = std::make_error_code(*peVar5);
        __ec_00._M_cat = eVar8._M_cat;
        __ec_00._4_4_ = 0;
        __ec_00._M_value = eVar8._M_value;
        std::system_error::system_error(psVar4,__ec_00,"Call to read(2) failed");
        __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
      }
    } while ((int)sVar6 == -1);
LAB_00111463:
    if (local_24 == 1) {
      pmVar7 = std::
               map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               ::operator[](&this->fd_worker_map_,(key_type *)((long)&event + 3));
      bVar1 = try_send_work(this,*pmVar7);
      ev.data.u32._0_1_ = (bVar1 ^ 0xffU) & 1;
    }
    else {
      ev.data.fd._0_1_ = 0;
    }
  }
  goto LAB_001112a2;
}

Assistant:

void WorkItemScheduler::work_dispatch()
{
    bool skip_polling = false;
    struct epoll_event ev = {0};
    Events event = Events::NONE;

    while (this->active_ || !this->work_.empty())
    {
        int rv = 0;

        if (!skip_polling)
        {
            ev = {0};
            do
            {
                rv = epoll_wait(this->epoll_fd_, &ev, 1, 100);
                if (rv == -1 && errno != EINTR)
                    throw SYS_ERROR(errno, "Call to epoll_wait(2) failed");
            } while (rv == -1);

            if (rv == 0)
                continue;

            do
            {
                rv = read(ev.data.fd, &event, sizeof(event));
                if (rv == -1 && errno != EINTR)
                    throw SYS_ERROR(errno, "Call to read(2) failed");
            } while (rv == -1);
        }

        switch (event)
        {
            case Events::WORK_REQ:
                skip_polling =
                    !this->try_send_work(this->fd_worker_map_[ev.data.fd]);
                break;
            default:
                skip_polling = false;
                break;
        }
    }
}